

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.c
# Opt level: O0

void OPL3_ChannelSet4Op(opl3_chip *chip,uint8_t data)

{
  byte local_13;
  byte local_12;
  uint8_t chnum;
  uint8_t bit;
  uint8_t data_local;
  opl3_chip *chip_local;
  
  for (local_12 = 0; local_12 < 6; local_12 = local_12 + 1) {
    local_13 = local_12;
    if (2 < local_12) {
      local_13 = local_12 + 6;
    }
    if (((int)(uint)data >> (local_12 & 0x1f) & 1U) == 0) {
      chip->channel[local_13].chtype = '\0';
      chip->channel[local_13 + 3].chtype = '\0';
      OPL3_ChannelUpdateAlg(chip->channel + local_13);
      OPL3_ChannelUpdateAlg(chip->channel + (local_13 + 3));
    }
    else {
      chip->channel[local_13].chtype = '\x01';
      chip->channel[local_13 + 3].chtype = '\x02';
      OPL3_ChannelUpdateAlg(chip->channel + local_13);
    }
  }
  return;
}

Assistant:

INLINE void OPL3_ChannelSet4Op(opl3_chip *chip, uint8_t data)
{
    uint8_t bit;
    uint8_t chnum;
    for (bit = 0; bit < 6; bit++)
    {
        chnum = bit;
        if (bit >= 3)
        {
            chnum += 9 - 3;
        }
        if ((data >> bit) & 0x01)
        {
            chip->channel[chnum].chtype = ch_4op;
            chip->channel[chnum + 3u].chtype = ch_4op2;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
        }
        else
        {
            chip->channel[chnum].chtype = ch_2op;
            chip->channel[chnum + 3u].chtype = ch_2op;
            OPL3_ChannelUpdateAlg(&chip->channel[chnum]);
            OPL3_ChannelUpdateAlg(&chip->channel[chnum + 3u]);
        }
    }
}